

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_options.h
# Opt level: O0

void __thiscall google::protobuf::compiler::csharp::Options::Options(Options *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  Options *local_10;
  Options *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,".cs",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->base_namespace,"",local_25);
  std::allocator<char>::~allocator(local_25);
  this->base_namespace_specified = false;
  this->internal_access = false;
  this->serializable = false;
  this->strip_nonfunctional_codegen = false;
  return;
}

Assistant:

Options()
      : file_extension(".cs"),
        base_namespace(""),
        base_namespace_specified(false),
        internal_access(false),
        serializable(false),
        strip_nonfunctional_codegen(false) {}